

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O3

c_int is_dual_infeasible(OSQPWorkspace *work,c_float eps_dual_inf)

{
  OSQPData *pOVar1;
  long lVar2;
  double dVar3;
  c_float cVar4;
  c_float cVar5;
  
  if ((work->settings->scaling == 0) || (work->settings->scaled_termination != 0)) {
    dVar3 = vec_norm_inf(work->delta_x,work->data->n);
    cVar5 = 1.0;
  }
  else {
    dVar3 = vec_scaled_norm_inf(work->scaling->D,work->delta_x,work->data->n);
    cVar5 = work->scaling->c;
  }
  if ((eps_dual_inf < dVar3) &&
     (cVar4 = vec_prod(work->data->q,work->delta_x,work->data->n),
     cVar4 < -cVar5 * eps_dual_inf * dVar3)) {
    mat_vec(work->data->P,work->delta_x,work->Pdelta_x,0);
    mat_tpose_vec(work->data->P,work->delta_x,work->Pdelta_x,1,1);
    if ((work->settings->scaling != 0) && (work->settings->scaled_termination == 0)) {
      vec_ew_prod(work->scaling->Dinv,work->Pdelta_x,work->Pdelta_x,work->data->n);
    }
    cVar4 = vec_norm_inf(work->Pdelta_x,work->data->n);
    if (cVar4 < cVar5 * eps_dual_inf * dVar3) {
      mat_vec(work->data->A,work->delta_x,work->Adelta_x,0);
      if ((work->settings->scaling != 0) && (work->settings->scaled_termination == 0)) {
        vec_ew_prod(work->scaling->Einv,work->Adelta_x,work->Adelta_x,work->data->m);
      }
      pOVar1 = work->data;
      if (pOVar1->m < 1) {
        return 1;
      }
      lVar2 = 0;
      while (((1e+26 < pOVar1->u[lVar2] || pOVar1->u[lVar2] == 1e+26 ||
              (work->Adelta_x[lVar2] <= dVar3 * eps_dual_inf)) &&
             ((pOVar1->l[lVar2] <= -1e+26 ||
              (-eps_dual_inf * dVar3 < work->Adelta_x[lVar2] ||
               -eps_dual_inf * dVar3 == work->Adelta_x[lVar2]))))) {
        lVar2 = lVar2 + 1;
        if (pOVar1->m == lVar2) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

c_int is_dual_infeasible(OSQPWorkspace *work, c_float eps_dual_inf) {
  // This function checks for the scaled dual infeasibility termination
  // criteria.
  //
  // 1) q * delta_x < - eps * || delta_x ||
  //
  // 2) ||P * delta_x || < eps * || delta_x ||
  //
  // 3) -> (A * delta_x)_i > -eps * || delta_x ||,    l_i != -inf
  //    -> (A * delta_x)_i <  eps * || delta_x ||,    u_i != inf
  //


  c_int   i; // Index for loops
  c_float norm_delta_x;
  c_float cost_scaling;

  // Compute norm of delta_x
  if (work->settings->scaling && !work->settings->scaled_termination) { // Unscale
                                                                        // if
                                                                        // necessary
    norm_delta_x = vec_scaled_norm_inf(work->scaling->D,
                                       work->delta_x,
                                       work->data->n);
    cost_scaling = work->scaling->c;
  } else {
    norm_delta_x = vec_norm_inf(work->delta_x, work->data->n);
    cost_scaling = 1.0;
  }

  // Prevent 0 division || delta_x || > 0
  if (norm_delta_x > eps_dual_inf) {
    // Normalize delta_x by its norm

    /* vec_mult_scalar(work->delta_x, 1./norm_delta_x, work->data->n); */

    // Check first if q'*delta_x < 0
    if (vec_prod(work->data->q, work->delta_x, work->data->n) <
        -cost_scaling * eps_dual_inf * norm_delta_x) {
      // Compute product P * delta_x (NB: P is store in upper triangular form)
      mat_vec(work->data->P, work->delta_x, work->Pdelta_x, 0);
      mat_tpose_vec(work->data->P, work->delta_x, work->Pdelta_x, 1, 1);

      // Scale if necessary
      if (work->settings->scaling && !work->settings->scaled_termination) {
        vec_ew_prod(work->scaling->Dinv,
                    work->Pdelta_x,
                    work->Pdelta_x,
                    work->data->n);
      }

      // Check if || P * delta_x || = 0
      if (vec_norm_inf(work->Pdelta_x, work->data->n) <
          cost_scaling * eps_dual_inf * norm_delta_x) {
        // Compute A * delta_x
        mat_vec(work->data->A, work->delta_x, work->Adelta_x, 0);

        // Scale if necessary
        if (work->settings->scaling && !work->settings->scaled_termination) {
          vec_ew_prod(work->scaling->Einv,
                      work->Adelta_x,
                      work->Adelta_x,
                      work->data->m);
        }

        // De Morgan Law Applied to dual infeasibility conditions for A * x
        // NB: Note that MIN_SCALING is used to adjust the infinity value
        //     in case the problem is scaled.
        for (i = 0; i < work->data->m; i++) {
          if (((work->data->u[i] < OSQP_INFTY * MIN_SCALING) &&
               (work->Adelta_x[i] >  eps_dual_inf * norm_delta_x)) ||
              ((work->data->l[i] > -OSQP_INFTY * MIN_SCALING) &&
               (work->Adelta_x[i] < -eps_dual_inf * norm_delta_x))) {
            // At least one condition not satisfied -> not dual infeasible
            return 0;
          }
        }

        // All conditions passed -> dual infeasible
        return 1;
      }
    }
  }

  // Conditions not satisfied -> not dual infeasible
  return 0;
}